

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderCheckMark(ImDrawList *draw_list,ImVec2 pos,ImU32 col,float sz)

{
  ImVec2 *pIVar1;
  float fVar2;
  ImVec2 *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar11._4_60_ = in_register_00001244;
  auVar11._0_4_ = sz;
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = pos;
  auVar12._0_4_ = sz / 5.0;
  auVar12._4_12_ = in_register_00001244._0_12_;
  auVar12 = vmaxss_avx(auVar12,ZEXT416(0x3f800000));
  auVar7 = vfnmadd231ss_fma(auVar11._0_16_,auVar12,SUB6416(ZEXT464(0x3f000000),0));
  fVar9 = auVar12._0_4_ * 0.25;
  auVar10 = vmovshdup_avx(auVar8._0_16_);
  auVar13._0_4_ = auVar7._0_4_ / 3.0;
  auVar13._4_12_ = auVar7._4_12_;
  fVar2 = pos.x + fVar9 + auVar13._0_4_;
  auVar10 = vfnmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ + auVar10._0_4_ + fVar9)),auVar13,
                             SUB6416(ZEXT464(0x3f000000),0));
  fVar9 = auVar10._0_4_;
  iVar5 = (draw_list->_Path).Size;
  iVar6 = (draw_list->_Path).Capacity;
  if (iVar5 == iVar6) {
    iVar5 = iVar5 + 1;
    if (iVar6 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar6 < iVar5) {
      pIVar3 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar3;
      (draw_list->_Path).Capacity = iVar5;
      auVar12 = ZEXT416((uint)auVar12._0_4_);
      auVar10 = ZEXT416((uint)fVar9);
    }
  }
  auVar7._8_4_ = 0x80000000;
  auVar7._0_8_ = 0x8000000080000000;
  auVar7._12_4_ = 0x80000000;
  auVar7 = vxorps_avx512vl(auVar13,auVar7);
  pIVar1 = (draw_list->_Path).Data;
  iVar5 = (draw_list->_Path).Size;
  pIVar1[iVar5].x = fVar2 - auVar13._0_4_;
  pIVar1[iVar5].y = fVar9 - auVar13._0_4_;
  iVar6 = (draw_list->_Path).Size;
  iVar4 = (draw_list->_Path).Capacity;
  iVar5 = iVar6 + 1;
  (draw_list->_Path).Size = iVar5;
  if (iVar5 == iVar4) {
    iVar6 = iVar6 + 2;
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar4 < iVar6) {
      pIVar3 = (ImVec2 *)MemAlloc((long)iVar6 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar3;
      (draw_list->_Path).Capacity = iVar6;
      auVar10 = ZEXT416(auVar10._0_4_);
    }
  }
  pIVar1 = (draw_list->_Path).Data;
  iVar5 = (draw_list->_Path).Size;
  pIVar1[iVar5].x = fVar2;
  pIVar1[iVar5].y = auVar10._0_4_;
  iVar6 = (draw_list->_Path).Size;
  iVar4 = (draw_list->_Path).Capacity;
  iVar5 = iVar6 + 1;
  (draw_list->_Path).Size = iVar5;
  if (iVar5 == iVar4) {
    iVar6 = iVar6 + 2;
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar4 < iVar6) {
      pIVar3 = (ImVec2 *)MemAlloc((long)iVar6 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar3;
      (draw_list->_Path).Capacity = iVar6;
      auVar10 = ZEXT416((uint)auVar10._0_4_);
    }
  }
  auVar10 = vfmadd213ss_fma(auVar7,SUB6416(ZEXT464(0x40000000),0),auVar10);
  auVar7 = vfmadd213ss_fma(auVar13,SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar2));
  pIVar1 = (draw_list->_Path).Data;
  iVar5 = (draw_list->_Path).Size;
  pIVar1[iVar5].x = auVar7._0_4_;
  pIVar1[iVar5].y = auVar10._0_4_;
  iVar5 = (draw_list->_Path).Size + 1;
  (draw_list->_Path).Size = iVar5;
  ImDrawList::AddPolyline(draw_list,(draw_list->_Path).Data,iVar5,col,false,auVar12._0_4_);
  (draw_list->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImDrawList* draw_list, ImVec2 pos, ImU32 col, float sz)
{
    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness * 0.5f;
    pos += ImVec2(thickness * 0.25f, thickness * 0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third * 0.5f;
    draw_list->PathLineTo(ImVec2(bx - third, by - third));
    draw_list->PathLineTo(ImVec2(bx, by));
    draw_list->PathLineTo(ImVec2(bx + third * 2.0f, by - third * 2.0f));
    draw_list->PathStroke(col, false, thickness);
}